

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

int Abc_GenSignedBoothPP(Gia_Man_t *p,int a,int b,int c,int d,int e)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int n11;
  int n10;
  int n09;
  int n08;
  int n07;
  int n06;
  int n05;
  int e_local;
  int d_local;
  int c_local;
  int b_local;
  int a_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManHashXor(p,d,e);
  iVar2 = Gia_ManHashXor(p,c,d);
  iVar3 = Abc_LitNot(iVar2);
  iVar3 = Gia_ManHashAnd(p,a,iVar3);
  iVar2 = Gia_ManHashAnd(p,b,iVar2);
  iVar3 = Abc_LitNot(iVar3);
  iVar1 = Gia_ManHashAnd(p,iVar1,iVar3);
  iVar1 = Gia_ManHashXor(p,iVar2,iVar1);
  iVar1 = Gia_ManHashXor(p,d,iVar1);
  return iVar1;
}

Assistant:

int Abc_GenSignedBoothPP( Gia_Man_t * p, int a, int b, int c, int d, int e )
{
/*
    abc>  lutexact -I 5 -N 7 -g F335ACC0

    05 = 4'b0110( d e )
    06 = 4'b0110( c d )
    07 = 4'b0100( a 06 )
    08 = 4'b1000( b 06 )
    09 = 4'b0100( 05 07 )
    10 = 4'b0110( 08 09 )
    11 = 4'b0110( d 10 )
*/
    int n05 = Gia_ManHashXor( p, d,   e   );
    int n06 = Gia_ManHashXor( p, c,   d   );
    int n07 = Gia_ManHashAnd( p, a,   Abc_LitNot(n06) );
    int n08 = Gia_ManHashAnd( p, b,   n06 );
    int n09 = Gia_ManHashAnd( p, n05, Abc_LitNot(n07) );
    int n10 = Gia_ManHashXor( p, n08, n09 );
    int n11 = Gia_ManHashXor( p, d,   n10 );
    return n11;
}